

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O1

void __thiscall
QArrayDataPointer<QCss::Value>::relocate
          (QArrayDataPointer<QCss::Value> *this,qsizetype offset,Value **data)

{
  Value *d_first;
  Value *pVVar1;
  
  d_first = this->ptr + offset;
  QtPrivate::q_relocate_overlap_n<QCss::Value,long_long>(this->ptr,this->size,d_first);
  if (data != (Value **)0x0) {
    pVVar1 = *data;
    if ((this->ptr <= pVVar1) && (pVVar1 < this->ptr + this->size)) {
      *data = pVVar1 + offset;
    }
  }
  this->ptr = d_first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }